

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O1

void __thiscall tst_RootIndexProxyModel::insertRow(tst_RootIndexProxyModel *this)

{
  undefined8 uVar1;
  quintptr qVar2;
  QAbstractItemModel *pQVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QAbstractItemModel *obj;
  QAbstractItemModelTester *this_00;
  QList<QVariant> arguments;
  RootIndexProxyModel proxyModel;
  QSignalSpy proxyRowsAboutToBeInsertedSpy;
  QSignalSpy proxyRowsInsertedSpy;
  QSignalSpy sourceRowsInsertedSpy;
  QSignalSpy sourceRowsAboutToBeInsertedSpy;
  QArrayDataPointer<QVariant> local_298;
  QModelIndex local_280;
  QModelIndex local_268;
  QModelIndex local_248;
  QSignalSpy local_230;
  QSignalSpy local_1b0;
  QSignalSpy local_130;
  QSignalSpy local_b0;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  obj = createTreeModel(&this->super_QObject);
  RootIndexProxyModel::RootIndexProxyModel((RootIndexProxyModel *)&local_248,(QObject *)0x0);
  this_00 = (QAbstractItemModelTester *)operator_new(0x10);
  QAbstractItemModelTester::QAbstractItemModelTester
            (this_00,(QAbstractItemModel *)&local_248,QtTest,(QObject *)obj);
  *(undefined ***)this_00 = &PTR_metaObject_00125c88;
  RootIndexProxyModel::setSourceModel((QAbstractItemModel *)&local_248);
  local_1b0._0_8_ = (undefined **)0xffffffffffffffff;
  local_1b0._8_8_ = 0;
  local_1b0.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  (**(code **)(*(long *)obj + 0x60))(&local_230,obj,1,0);
  RootIndexProxyModel::setRootIndex(&local_248);
  QSignalSpy::QSignalSpy
            (&local_230,(QObject *)&local_248,"2rowsAboutToBeInserted(QModelIndex, int, int)");
  cVar4 = QTest::qVerify(local_230.sig.d.size != 0,"proxyRowsAboutToBeInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0xa1);
  if (cVar4 != '\0') {
    QSignalSpy::QSignalSpy(&local_1b0,(QObject *)&local_248,"2rowsInserted(QModelIndex, int, int)");
    cVar4 = QTest::qVerify(local_1b0.sig.d.size != 0,"proxyRowsInsertedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0xa3);
    if (cVar4 != '\0') {
      QSignalSpy::QSignalSpy
                (&local_b0,(QObject *)obj,"2rowsAboutToBeInserted(QModelIndex, int, int)");
      cVar4 = QTest::qVerify(local_b0.sig.d.size != 0,"sourceRowsAboutToBeInsertedSpy.isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0xa5);
      if (cVar4 != '\0') {
        QSignalSpy::QSignalSpy(&local_130,(QObject *)obj,"2rowsInserted(QModelIndex, int, int)");
        cVar4 = QTest::qVerify(local_130.sig.d.size != 0,"sourceRowsInsertedSpy.isValid()","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0xa7);
        if (cVar4 != '\0') {
          local_298.d = (Data *)0xffffffffffffffff;
          local_298.ptr = (QVariant *)0x0;
          local_298.size = 0;
          (**(code **)(*(long *)obj + 0x60))(&local_280,obj,1,0);
          iVar6 = (**(code **)(*(long *)obj + 0x78))(obj,&local_280);
          local_280._0_8_ = (Data *)0xffffffffffffffff;
          local_280.i = 0;
          local_280.m = (QAbstractItemModel *)0x0;
          iVar7 = RootIndexProxyModel::rowCount(&local_248);
          cVar4 = QTest::qCompare(iVar6,iVar7,"oldRowCount","proxyModel.rowCount()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                  ,0xa9);
          if (cVar4 != '\0') {
            local_280._0_8_ = (Data *)0xffffffffffffffff;
            local_280.i = 0;
            local_280.m = (QAbstractItemModel *)0x0;
            RootIndexProxyModel::insertRows((int)&local_248,1,(QModelIndex *)0x1);
            local_280._0_8_ = (Data *)0xffffffffffffffff;
            local_280.i = 0;
            local_280.m = (QAbstractItemModel *)0x0;
            iVar7 = RootIndexProxyModel::rowCount(&local_248);
            cVar4 = QTest::qCompare(iVar6 + 1,iVar7,"oldRowCount + 1","proxyModel.rowCount()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                    ,0xab);
            if (cVar4 != '\0') {
              local_298.d = (Data *)0xffffffffffffffff;
              local_298.ptr = (QVariant *)0x0;
              local_298.size = 0;
              (**(code **)(*(long *)obj + 0x60))(&local_280,obj,1,0);
              iVar7 = (**(code **)(*(long *)obj + 0x78))(obj,&local_280);
              cVar4 = QTest::qCompare(iVar6 + 1,iVar7,"oldRowCount + 1",
                                      "baseModel->rowCount(baseModel->index(1, 0))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                      ,0xac);
              if (cVar4 != '\0') {
                cVar4 = QTest::qCompare(local_230.super_QList<QList<QVariant>_>.d.size,1,
                                        "proxyRowsAboutToBeInsertedSpy.count()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                        ,0xad);
                if (cVar4 != '\0') {
                  QList<QList<QVariant>_>::takeFirst
                            ((value_type *)&local_298,
                             (QList<QList<QVariant>_> *)((long)&local_230 + 0x10));
                  QVariant::value<QModelIndex>(&local_280,local_298.ptr);
                  local_268._0_8_ = (Data *)0xffffffffffffffff;
                  local_268.i = 0;
                  local_268.m = (QAbstractItemModel *)0x0;
                  bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                    (&local_280,&local_268,"arguments.at(0).value<QModelIndex>()",
                                     "QModelIndex()",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0xaf);
                  if (bVar5) {
                    iVar6 = QVariant::value<int>(local_298.ptr + 1);
                    cVar4 = QTest::qCompare(iVar6,1,"arguments.at(1).value<int>()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                            ,0xb0);
                    if (cVar4 != '\0') {
                      iVar6 = QVariant::value<int>(local_298.ptr + 2);
                      cVar4 = QTest::qCompare(iVar6,1,"arguments.at(2).value<int>()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                              ,0xb1);
                      if (cVar4 != '\0') {
                        cVar4 = QTest::qCompare(local_1b0.super_QList<QList<QVariant>_>.d.size,1,
                                                "proxyRowsInsertedSpy.count()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                ,0xb2);
                        if (cVar4 != '\0') {
                          QList<QList<QVariant>_>::takeFirst
                                    ((value_type *)&local_268,
                                     (QList<QList<QVariant>_> *)((long)&local_1b0 + 0x10));
                          pQVar3 = local_268.m;
                          qVar2 = local_268.i;
                          uVar1 = local_268._0_8_;
                          local_280.m = (QAbstractItemModel *)local_298.size;
                          local_280.i = (quintptr)local_298.ptr;
                          local_280._0_8_ = local_298.d;
                          local_268._0_8_ = (Data *)0x0;
                          local_268.i = 0;
                          local_268.m = (QAbstractItemModel *)0x0;
                          local_298.d = (Data *)uVar1;
                          local_298.ptr = (QVariant *)qVar2;
                          local_298.size = (qsizetype)pQVar3;
                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                    ((QArrayDataPointer<QVariant> *)&local_280);
                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                    ((QArrayDataPointer<QVariant> *)&local_268);
                          QVariant::value<QModelIndex>(&local_280,local_298.ptr);
                          local_268._0_8_ = (Data *)0xffffffffffffffff;
                          local_268.i = 0;
                          local_268.m = (QAbstractItemModel *)0x0;
                          bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                            (&local_280,&local_268,
                                             "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0xb4);
                          if (bVar5) {
                            iVar6 = QVariant::value<int>(local_298.ptr + 1);
                            cVar4 = QTest::qCompare(iVar6,1,"arguments.at(1).value<int>()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb5);
                            if (cVar4 != '\0') {
                              iVar6 = QVariant::value<int>(local_298.ptr + 2);
                              cVar4 = QTest::qCompare(iVar6,1,"arguments.at(2).value<int>()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb6);
                              if (cVar4 != '\0') {
                                cVar4 = QTest::qCompare(local_b0.super_QList<QList<QVariant>_>.d.
                                                        size,1,
                                                  "sourceRowsAboutToBeInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb7);
                                if (cVar4 != '\0') {
                                  QList<QList<QVariant>_>::takeFirst
                                            ((value_type *)&local_268,
                                             (QList<QList<QVariant>_> *)((long)&local_b0 + 0x10));
                                  pQVar3 = local_268.m;
                                  qVar2 = local_268.i;
                                  uVar1 = local_268._0_8_;
                                  local_280.m = (QAbstractItemModel *)local_298.size;
                                  local_280.i = (quintptr)local_298.ptr;
                                  local_280._0_8_ = local_298.d;
                                  local_268._0_8_ = (Data *)0x0;
                                  local_268.i = 0;
                                  local_268.m = (QAbstractItemModel *)0x0;
                                  local_298.d = (Data *)uVar1;
                                  local_298.ptr = (QVariant *)qVar2;
                                  local_298.size = (qsizetype)pQVar3;
                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                            ((QArrayDataPointer<QVariant> *)&local_280);
                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                            ((QArrayDataPointer<QVariant> *)&local_268);
                                  QVariant::value<QModelIndex>(&local_280,local_298.ptr);
                                  local_30 = 0xffffffffffffffff;
                                  local_28 = 0;
                                  uStack_20 = 0;
                                  (**(code **)(*(long *)obj + 0x60))(&local_268,obj,1,0);
                                  bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                                    (&local_280,&local_268,
                                                     "arguments.at(0).value<QModelIndex>()",
                                                     "baseModel->index(1, 0)",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb9);
                                  if (bVar5) {
                                    iVar6 = QVariant::value<int>(local_298.ptr + 1);
                                    cVar4 = QTest::qCompare(iVar6,1,"arguments.at(1).value<int>()",
                                                            "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xba);
                                    if (cVar4 != '\0') {
                                      iVar6 = QVariant::value<int>(local_298.ptr + 2);
                                      cVar4 = QTest::qCompare(iVar6,1,"arguments.at(2).value<int>()"
                                                              ,"1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbb);
                                      if (cVar4 != '\0') {
                                        cVar4 = QTest::qCompare(local_130.
                                                                super_QList<QList<QVariant>_>.d.size
                                                                ,1,"sourceRowsInsertedSpy.count()",
                                                                "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbc);
                                        if (cVar4 != '\0') {
                                          QList<QList<QVariant>_>::takeFirst
                                                    ((value_type *)&local_268,
                                                     (QList<QList<QVariant>_> *)
                                                     ((long)&local_130 + 0x10));
                                          pQVar3 = local_268.m;
                                          qVar2 = local_268.i;
                                          uVar1 = local_268._0_8_;
                                          local_280.m = (QAbstractItemModel *)local_298.size;
                                          local_280.i = (quintptr)local_298.ptr;
                                          local_280._0_8_ = local_298.d;
                                          local_268._0_8_ = (Data *)0x0;
                                          local_268.i = 0;
                                          local_268.m = (QAbstractItemModel *)0x0;
                                          local_298.d = (Data *)uVar1;
                                          local_298.ptr = (QVariant *)qVar2;
                                          local_298.size = (qsizetype)pQVar3;
                                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                    ((QArrayDataPointer<QVariant> *)&local_280);
                                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                    ((QArrayDataPointer<QVariant> *)&local_268);
                                          QVariant::value<QModelIndex>(&local_280,local_298.ptr);
                                          local_30 = 0xffffffffffffffff;
                                          local_28 = 0;
                                          uStack_20 = 0;
                                          (**(code **)(*(long *)obj + 0x60))(&local_268,obj,1,0);
                                          bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                                            (&local_280,&local_268,
                                                             "arguments.at(0).value<QModelIndex>()",
                                                             "baseModel->index(1, 0)",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbe);
                                          if (bVar5) {
                                            iVar6 = QVariant::value<int>(local_298.ptr + 1);
                                            cVar4 = QTest::qCompare(iVar6,1,
                                                  "arguments.at(1).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbf);
                                            if (cVar4 != '\0') {
                                              iVar6 = QVariant::value<int>(local_298.ptr + 2);
                                              cVar4 = QTest::qCompare(iVar6,1,
                                                  "arguments.at(2).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xc0);
                                              if (cVar4 != '\0') {
                                                QObject::deleteLater();
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_298);
                }
              }
            }
          }
        }
        local_130._0_8_ = &PTR_metaObject_00125ba0;
        QObject::~QObject((QObject *)((long)&local_130 + 0x58));
        if (&(local_130.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_130.args.d.d)->super_QArrayData,4,8);
          }
        }
        if (&(local_130.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_130.sig.d.d)->super_QArrayData,1,8);
          }
        }
        QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
                  ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_130 + 0x10));
        QObject::~QObject(&local_130.super_QObject);
      }
      local_b0._0_8_ = &PTR_metaObject_00125ba0;
      QObject::~QObject((QObject *)((long)&local_b0 + 0x58));
      if (&(local_b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_b0.args.d.d)->super_QArrayData,4,8);
        }
      }
      if (&(local_b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_b0.sig.d.d)->super_QArrayData,1,8);
        }
      }
      QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
                ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_b0 + 0x10));
      QObject::~QObject(&local_b0.super_QObject);
    }
    local_1b0._0_8_ = &PTR_metaObject_00125ba0;
    QObject::~QObject((QObject *)((long)&local_1b0 + 0x58));
    if (&(local_1b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_1b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_1b0.args.d.d)->super_QArrayData,4,8);
      }
    }
    if (&(local_1b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_1b0.sig.d.d)->super_QArrayData,1,8);
      }
    }
    QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
              ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_1b0 + 0x10));
    QObject::~QObject(&local_1b0.super_QObject);
  }
  local_230._0_8_ = &PTR_metaObject_00125ba0;
  QObject::~QObject((QObject *)((long)&local_230 + 0x58));
  if (&(local_230.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_230.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_230.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_230.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_230 + 0x10));
  QObject::~QObject(&local_230.super_QObject);
  RootIndexProxyModel::~RootIndexProxyModel((RootIndexProxyModel *)&local_248);
  return;
}

Assistant:

void tst_RootIndexProxyModel::insertRow()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = createTreeModel(this);
    RootIndexProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setRootIndex(baseModel->index(1, 0));
    QSignalSpy proxyRowsAboutToBeInsertedSpy(&proxyModel, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxyRowsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxyRowsInsertedSpy(&proxyModel, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxyRowsInsertedSpy.isValid());
    QSignalSpy sourceRowsAboutToBeInsertedSpy(baseModel, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(sourceRowsAboutToBeInsertedSpy.isValid());
    QSignalSpy sourceRowsInsertedSpy(baseModel, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(sourceRowsInsertedSpy.isValid());
    int oldRowCount = baseModel->rowCount(baseModel->index(1, 0));
    QCOMPARE(oldRowCount, proxyModel.rowCount());
    proxyModel.insertRows(1, 1);
    QCOMPARE(oldRowCount + 1, proxyModel.rowCount());
    QCOMPARE(oldRowCount + 1, baseModel->rowCount(baseModel->index(1, 0)));
    QCOMPARE(proxyRowsAboutToBeInsertedSpy.count(), 1);
    QList<QVariant> arguments = proxyRowsAboutToBeInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(proxyRowsInsertedSpy.count(), 1);
    arguments = proxyRowsInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsAboutToBeInsertedSpy.count(), 1);
    arguments = sourceRowsAboutToBeInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsInsertedSpy.count(), 1);
    arguments = sourceRowsInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}